

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

Ref __thiscall
wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::
ExpressionProcessor::visitBinary(wasm::Binary__(void *this,Binary *curr)

{
  IString nextResult;
  IString nextResult_00;
  bool bVar1;
  BasicType BVar2;
  JsType type;
  Ref RVar3;
  Ref node;
  Fatal *this_00;
  Ref in_R8;
  IString target;
  IString target_00;
  IString target_01;
  IString op;
  IString op_00;
  IString op_01;
  IString op_02;
  IString op_03;
  IString op_04;
  IString op_05;
  IString op_06;
  IString op_07;
  IString op_08;
  IString op_09;
  IString op_10;
  IString op_11;
  IString op_12;
  IString op_13;
  IString op_14;
  IString op_15;
  IString op_16;
  IString op_17;
  IString op_18;
  IString op_19;
  IString op_20;
  IString op_21;
  IString op_22;
  IString op_23;
  IString op_24;
  IString op_25;
  IString op_26;
  IString op_27;
  IString op_28;
  IString op_29;
  IString op_30;
  IString op_31;
  Fatal local_980;
  Value *local_7f8;
  BasicType local_7f0 [4];
  Fatal local_7e0;
  Value *local_658;
  Value *local_650;
  ValueBuilder *local_648;
  size_t local_640;
  Value *local_638;
  Value *local_630;
  Value *local_628;
  ValueBuilder *local_620;
  size_t local_618;
  Value *local_610;
  Value *local_608;
  Value *local_600;
  size_t local_5f8;
  Value *local_5f0;
  Value *local_5e8;
  Value *local_5e0;
  Value *local_5d8;
  size_t local_5d0;
  Value *local_5c8;
  Value *local_5c0;
  Value *local_5b8;
  Value *local_5b0;
  size_t local_5a8;
  Value *local_5a0;
  Value *local_598;
  Value *local_590;
  Value *local_588;
  size_t local_580;
  Value *local_578;
  Value *local_570;
  Value *local_568;
  Value *local_560;
  size_t local_558;
  Value *local_550;
  Value *local_548;
  Value *local_540;
  size_t local_538;
  Value *local_530;
  Value *local_528;
  Value *local_520;
  size_t local_518;
  Value *local_510;
  Value *local_508;
  Value *local_500;
  size_t local_4f8;
  Value *local_4f0;
  Value *local_4e8;
  Value *local_4e0;
  size_t local_4d8;
  Value *local_4d0;
  Value *local_4c8;
  Value *local_4c0;
  size_t local_4b8;
  Value *local_4b0;
  Value *local_4a8;
  Value *local_4a0;
  Ref local_498;
  size_t local_490;
  Value *local_488;
  Value *local_480;
  Value *local_478;
  Value *local_470;
  Ref local_468;
  size_t local_460;
  Value *local_458;
  Value *local_450;
  Value *local_448;
  Value *local_440;
  Ref local_438;
  size_t local_430;
  Value *local_428;
  Value *local_420;
  Value *local_418;
  Value *local_410;
  Ref local_408;
  size_t local_400;
  Value *local_3f8;
  Value *local_3f0;
  Value *local_3e8;
  Value *local_3e0;
  Ref local_3d8;
  size_t local_3d0;
  Value *local_3c8;
  Value *local_3c0;
  Value *local_3b8;
  Value *local_3b0;
  Ref local_3a8;
  size_t local_3a0;
  Value *local_398;
  Value *local_390;
  Value *local_388;
  Value *local_380;
  Ref local_378;
  size_t local_370;
  Value *local_368;
  Value *local_360;
  Value *local_358;
  Value *local_350;
  Ref local_348;
  size_t local_340;
  Value *local_338;
  Value *local_330;
  Value *local_328;
  Value *local_320;
  Ref local_318;
  size_t local_310;
  Value *local_308;
  Value *local_300;
  Value *local_2f8;
  Value *local_2f0;
  Ref local_2e8;
  size_t local_2e0;
  Value *local_2d8;
  Value *local_2d0;
  Value *local_2c8;
  Value *local_2c0;
  size_t local_2b8;
  Value *local_2b0;
  Value *local_2a8;
  Value *local_2a0;
  Value *local_298;
  size_t local_290;
  Value *local_288;
  Value *local_280;
  Value *local_278;
  Value *local_270;
  size_t local_268;
  Value *local_260;
  Value *local_258;
  Value *local_250;
  Value *local_248;
  size_t local_240;
  Value *local_238;
  Value *local_230;
  Value *local_228;
  Value *local_220;
  size_t local_218;
  Value *local_210;
  Value *local_208;
  Value *local_200;
  Value *local_1f8;
  size_t local_1f0;
  Value *local_1e8;
  Value *local_1e0;
  Value *local_1d8;
  Value *local_1d0;
  Ref local_1c8;
  size_t local_1c0;
  Value *local_1b8;
  Value *local_1b0;
  Value *local_1a8;
  Value *local_1a0;
  Value *local_198;
  Ref local_190;
  size_t local_188;
  Value *local_180;
  Value *local_178;
  Value *local_170;
  Value *local_168;
  Value *local_160;
  Ref local_158;
  size_t local_150;
  Value *local_148;
  Value *local_140;
  Value *local_138;
  Value *local_130;
  Value *local_128;
  Ref local_120;
  size_t local_118;
  Value *local_110;
  Value *local_108;
  Value *local_100;
  Value *local_f8;
  Value *local_f0;
  size_t local_e8;
  Value *local_e0;
  Value *local_d8;
  Value *local_d0;
  ValueBuilder *local_c8;
  size_t local_c0;
  BasicType local_b4;
  Value *local_b0;
  Value *local_a8;
  size_t local_a0;
  Value *local_98;
  Value *local_90;
  Value *local_88;
  Value *local_80;
  size_t local_78;
  Value *local_70;
  Value *local_68;
  Ref local_60;
  Ref ret;
  Ref right;
  Ref left;
  Binary *curr_local;
  ExpressionProcessor *this_local;
  
  nextResult_00.str._M_str = DAT_03192d88;
  nextResult_00.str._M_len = (size_t)EXPRESSION_RESULT;
  RVar3 = visit(wasm::Expression*,wasm::IString_(this,curr->left,nextResult_00);
  ret.inst = EXPRESSION_RESULT;
  nextResult.str._M_str = DAT_03192d88;
  nextResult.str._M_len = (size_t)EXPRESSION_RESULT;
  node = visit(wasm::Expression*,wasm::IString_(this,curr->right,nextResult);
  cashew::Ref::Ref(&local_60,(Value *)0x0);
  BVar2 = wasm::Type::getBasic
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.
                      type);
  if (BVar2 != i32) {
    if (1 < BVar2 - f32) {
      Fatal::Fatal(&local_980);
      this_00 = Fatal::operator<<(&local_980,(char (*) [27])"Unhandled type in binary: ");
      Fatal::operator<<(this_00,curr);
      Fatal::~Fatal(&local_980);
    }
    switch(curr->op) {
    case AddFloat32:
    case AddFloat64:
      local_588 = cashew::PLUS.inst;
      local_580 = DAT_03193170;
      op_28.str._M_str = (char *)node.inst;
      op_28.str._M_len = DAT_03193170;
      local_590 = node.inst;
      local_578 = RVar3.inst;
      local_570 = (Value *)cashew::ValueBuilder::makeBinary(RVar3.inst,cashew::PLUS,op_28,in_R8);
      local_60 = (Ref)local_570;
      break;
    case SubFloat32:
    case SubFloat64:
      local_5b0 = cashew::MINUS.inst;
      local_5a8 = DAT_03193180;
      op_29.str._M_str = (char *)node.inst;
      op_29.str._M_len = DAT_03193180;
      local_5b8 = node.inst;
      local_5a0 = RVar3.inst;
      local_598 = (Value *)cashew::ValueBuilder::makeBinary(RVar3.inst,cashew::MINUS,op_29,in_R8);
      local_60 = (Ref)local_598;
      break;
    case MulFloat32:
    case MulFloat64:
      local_5d8 = cashew::MUL.inst;
      local_5d0 = DAT_03193260;
      op_30.str._M_str = (char *)node.inst;
      op_30.str._M_len = DAT_03193260;
      local_5e0 = node.inst;
      local_5c8 = RVar3.inst;
      local_5c0 = (Value *)cashew::ValueBuilder::makeBinary(RVar3.inst,cashew::MUL,op_30,in_R8);
      local_60 = (Ref)local_5c0;
      break;
    case DivFloat32:
    case DivFloat64:
      local_600 = cashew::DIV.inst;
      local_5f8 = DAT_03193240;
      op_31.str._M_str = (char *)node.inst;
      op_31.str._M_len = DAT_03193240;
      local_608 = node.inst;
      local_5f0 = RVar3.inst;
      local_5e8 = (Value *)cashew::ValueBuilder::makeBinary(RVar3.inst,cashew::DIV,op_31,in_R8);
      local_60 = (Ref)local_5e8;
      break;
    case CopySignFloat32:
    case CopySignFloat64:
    default:
      Fatal::Fatal(&local_7e0);
      Fatal::operator<<(&local_7e0,(char (*) [34])"Unhandled binary float operator: ");
      Fatal::~Fatal(&local_7e0);
    case MinFloat32:
    case MinFloat64:
      local_620 = MATH_MIN;
      local_618 = DAT_03192be8;
      target_00.str._M_str = (char *)RVar3.inst;
      target_00.str._M_len = DAT_03192be8;
      local_630 = node.inst;
      local_628 = RVar3.inst;
      local_610 = (Value *)cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref>
                                     (MATH_MIN,target_00,node,in_R8);
      local_60 = (Ref)local_610;
      break;
    case MaxFloat32:
    case MaxFloat64:
      local_648 = MATH_MAX;
      local_640 = DAT_03192bf8;
      target_01.str._M_str = (char *)RVar3.inst;
      target_01.str._M_len = DAT_03192bf8;
      local_658 = node.inst;
      local_650 = RVar3.inst;
      local_638 = (Value *)cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref>
                                     (MATH_MAX,target_01,node,in_R8);
      local_60 = (Ref)local_638;
    }
    local_7f0[0] = f32;
    bVar1 = wasm::Type::operator==
                      (&(curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.
                        type,local_7f0);
    if (!bVar1) {
      return (Ref)local_60.inst;
    }
    local_7f8 = local_60.inst;
    RVar3 = makeJsCoercion(local_60,JS_FLOAT);
    return (Ref)RVar3.inst;
  }
  switch(curr->op) {
  case AddInt32:
    local_80 = cashew::PLUS.inst;
    local_78 = DAT_03193170;
    op.str._M_str = (char *)node.inst;
    op.str._M_len = DAT_03193170;
    local_88 = node.inst;
    local_70 = RVar3.inst;
    local_68 = (Value *)cashew::ValueBuilder::makeBinary(RVar3.inst,cashew::PLUS,op,in_R8);
    local_60 = (Ref)local_68;
    goto LAB_02716842;
  case SubInt32:
    local_a8 = cashew::MINUS.inst;
    local_a0 = DAT_03193180;
    op_00.str._M_str = (char *)node.inst;
    op_00.str._M_len = DAT_03193180;
    local_b0 = node.inst;
    local_98 = RVar3.inst;
    local_90 = (Value *)cashew::ValueBuilder::makeBinary(RVar3.inst,cashew::MINUS,op_00,in_R8);
    local_60 = (Ref)local_90;
    goto LAB_02716842;
  case MulInt32:
    local_b4 = i32;
    bVar1 = wasm::Type::operator==
                      (&(curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.
                        type,&local_b4);
    if (bVar1) {
      local_c8 = MATH_IMUL;
      local_c0 = DAT_03192b78;
      target.str._M_str = (char *)RVar3.inst;
      target.str._M_len = DAT_03192b78;
      local_d8 = node.inst;
      local_d0 = RVar3.inst;
      this_local = (ExpressionProcessor *)
                   cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref>
                             (MATH_IMUL,target,node,in_R8);
    }
    else {
      local_f0 = cashew::MUL.inst;
      local_e8 = DAT_03193260;
      op_01.str._M_str = (char *)node.inst;
      op_01.str._M_len = DAT_03193260;
      local_f8 = node.inst;
      local_e0 = RVar3.inst;
      this_local = (ExpressionProcessor *)
                   cashew::ValueBuilder::makeBinary
                             ((ValueBuilder *)RVar3.inst,cashew::MUL,op_01,in_R8);
    }
    break;
  case DivSInt32:
    local_110 = RVar3.inst;
    local_108 = (Value *)makeSigning(RVar3,JS_SIGNED);
    local_120.inst = cashew::DIV.inst;
    local_118 = DAT_03193240;
    local_130 = node.inst;
    local_128 = (Value *)makeSigning(node,JS_SIGNED);
    op_02.str._M_str = (char *)local_128;
    op_02.str._M_len = local_118;
    local_100 = (Value *)cashew::ValueBuilder::makeBinary
                                   ((ValueBuilder *)local_108,local_120,op_02,in_R8);
    local_60 = (Ref)local_100;
    goto LAB_02716842;
  case DivUInt32:
    local_148 = RVar3.inst;
    local_140 = (Value *)makeSigning(RVar3,JS_UNSIGNED);
    local_158.inst = cashew::DIV.inst;
    local_150 = DAT_03193240;
    local_168 = node.inst;
    local_160 = (Value *)makeSigning(node,JS_UNSIGNED);
    op_03.str._M_str = (char *)local_160;
    op_03.str._M_len = local_150;
    local_138 = (Value *)cashew::ValueBuilder::makeBinary
                                   ((ValueBuilder *)local_140,local_158,op_03,in_R8);
    local_60 = (Ref)local_138;
    goto LAB_02716842;
  case RemSInt32:
    local_180 = RVar3.inst;
    local_178 = (Value *)makeSigning(RVar3,JS_SIGNED);
    local_190.inst = cashew::MOD;
    local_188 = DAT_03193250;
    local_1a0 = node.inst;
    local_198 = (Value *)makeSigning(node,JS_SIGNED);
    op_04.str._M_str = (char *)local_198;
    op_04.str._M_len = local_188;
    local_170 = (Value *)cashew::ValueBuilder::makeBinary
                                   ((ValueBuilder *)local_178,local_190,op_04,in_R8);
    local_60 = (Ref)local_170;
    goto LAB_02716842;
  case RemUInt32:
    local_1b8 = RVar3.inst;
    local_1b0 = (Value *)makeSigning(RVar3,JS_UNSIGNED);
    local_1c8.inst = cashew::MOD;
    local_1c0 = DAT_03193250;
    local_1d8 = node.inst;
    local_1d0 = (Value *)makeSigning(node,JS_UNSIGNED);
    op_05.str._M_str = (char *)local_1d0;
    op_05.str._M_len = local_1c0;
    local_1a8 = (Value *)cashew::ValueBuilder::makeBinary
                                   ((ValueBuilder *)local_1b0,local_1c8,op_05,in_R8);
    local_60 = (Ref)local_1a8;
    goto LAB_02716842;
  case AndInt32:
    local_1f8 = cashew::AND.inst;
    local_1f0 = DAT_031931a0;
    op_06.str._M_str = (char *)node.inst;
    op_06.str._M_len = DAT_031931a0;
    local_200 = node.inst;
    local_1e8 = RVar3.inst;
    local_1e0 = (Value *)cashew::ValueBuilder::makeBinary(RVar3.inst,cashew::AND,op_06,in_R8);
    local_60 = (Ref)local_1e0;
    goto LAB_02716842;
  case OrInt32:
    local_220 = cashew::OR.inst;
    local_218 = DAT_03193190;
    op_07.str._M_str = (char *)node.inst;
    op_07.str._M_len = DAT_03193190;
    local_228 = node.inst;
    local_210 = RVar3.inst;
    local_208 = (Value *)cashew::ValueBuilder::makeBinary(RVar3.inst,cashew::OR,op_07,in_R8);
    local_60 = (Ref)local_208;
    goto LAB_02716842;
  case XorInt32:
    local_248 = cashew::XOR.inst;
    local_240 = DAT_031931b0;
    op_08.str._M_str = (char *)node.inst;
    op_08.str._M_len = DAT_031931b0;
    local_250 = node.inst;
    local_238 = RVar3.inst;
    local_230 = (Value *)cashew::ValueBuilder::makeBinary(RVar3.inst,cashew::XOR,op_08,in_R8);
    local_60 = (Ref)local_230;
    goto LAB_02716842;
  case ShlInt32:
    local_270 = cashew::LSHIFT.inst;
    local_268 = DAT_03193280;
    op_09.str._M_str = (char *)node.inst;
    op_09.str._M_len = DAT_03193280;
    local_278 = node.inst;
    local_260 = RVar3.inst;
    local_258 = (Value *)cashew::ValueBuilder::makeBinary(RVar3.inst,cashew::LSHIFT,op_09,in_R8);
    local_60 = (Ref)local_258;
    goto LAB_02716842;
  case ShrSInt32:
    local_2c0 = cashew::RSHIFT.inst;
    local_2b8 = DAT_03193270;
    op_11.str._M_str = (char *)node.inst;
    op_11.str._M_len = DAT_03193270;
    local_2c8 = node.inst;
    local_2b0 = RVar3.inst;
    local_2a8 = (Value *)cashew::ValueBuilder::makeBinary(RVar3.inst,cashew::RSHIFT,op_11,in_R8);
    local_60 = (Ref)local_2a8;
    goto LAB_02716842;
  case ShrUInt32:
    local_298 = cashew::TRSHIFT.inst;
    local_290 = DAT_03193290;
    op_10.str._M_str = (char *)node.inst;
    op_10.str._M_len = DAT_03193290;
    local_2a0 = node.inst;
    local_288 = RVar3.inst;
    local_280 = (Value *)cashew::ValueBuilder::makeBinary(RVar3.inst,cashew::TRSHIFT,op_10,in_R8);
    local_60 = (Ref)local_280;
LAB_02716842:
    RVar3.inst = local_60.inst;
    type = wasmToJsType((Type)(curr->super_SpecificExpression<(wasm::Expression::Id)16>).
                              super_Expression.type.id);
    this_local = (ExpressionProcessor *)makeJsCoercion(RVar3,type);
    break;
  case RotLInt32:
  case RotRInt32:
    handle_unreachable("should be removed already",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                       ,0x77c);
  case EqInt32:
    local_2d8 = RVar3.inst;
    local_2d0 = (Value *)makeSigning(RVar3,JS_SIGNED);
    local_2e8.inst = cashew::EQ.inst;
    local_2e0 = DAT_03193220;
    local_2f8 = node.inst;
    local_2f0 = (Value *)makeSigning(node,JS_SIGNED);
    op_12.str._M_str = (char *)local_2f0;
    op_12.str._M_len = local_2e0;
    this_local = (ExpressionProcessor *)
                 cashew::ValueBuilder::makeBinary((ValueBuilder *)local_2d0,local_2e8,op_12,in_R8);
    break;
  case NeInt32:
    local_308 = RVar3.inst;
    local_300 = (Value *)makeSigning(RVar3,JS_SIGNED);
    local_318.inst = cashew::NE.inst;
    local_310 = DAT_03193230;
    local_328 = node.inst;
    local_320 = (Value *)makeSigning(node,JS_SIGNED);
    op_13.str._M_str = (char *)local_320;
    op_13.str._M_len = local_310;
    this_local = (ExpressionProcessor *)
                 cashew::ValueBuilder::makeBinary((ValueBuilder *)local_300,local_318,op_13,in_R8);
    break;
  case LtSInt32:
    local_338 = RVar3.inst;
    local_330 = (Value *)makeSigning(RVar3,JS_SIGNED);
    local_348.inst = cashew::LT.inst;
    local_340 = DAT_031931e0;
    local_358 = node.inst;
    local_350 = (Value *)makeSigning(node,JS_SIGNED);
    op_14.str._M_str = (char *)local_350;
    op_14.str._M_len = local_340;
    this_local = (ExpressionProcessor *)
                 cashew::ValueBuilder::makeBinary((ValueBuilder *)local_330,local_348,op_14,in_R8);
    break;
  case LtUInt32:
    local_368 = RVar3.inst;
    local_360 = (Value *)makeSigning(RVar3,JS_UNSIGNED);
    local_378.inst = cashew::LT.inst;
    local_370 = DAT_031931e0;
    local_388 = node.inst;
    local_380 = (Value *)makeSigning(node,JS_UNSIGNED);
    op_15.str._M_str = (char *)local_380;
    op_15.str._M_len = local_370;
    this_local = (ExpressionProcessor *)
                 cashew::ValueBuilder::makeBinary((ValueBuilder *)local_360,local_378,op_15,in_R8);
    break;
  case LeSInt32:
    local_398 = RVar3.inst;
    local_390 = (Value *)makeSigning(RVar3,JS_SIGNED);
    local_3a8.inst = cashew::LE.inst;
    local_3a0 = DAT_03193200;
    local_3b8 = node.inst;
    local_3b0 = (Value *)makeSigning(node,JS_SIGNED);
    op_16.str._M_str = (char *)local_3b0;
    op_16.str._M_len = local_3a0;
    this_local = (ExpressionProcessor *)
                 cashew::ValueBuilder::makeBinary((ValueBuilder *)local_390,local_3a8,op_16,in_R8);
    break;
  case LeUInt32:
    local_3c8 = RVar3.inst;
    local_3c0 = (Value *)makeSigning(RVar3,JS_UNSIGNED);
    local_3d8.inst = cashew::LE.inst;
    local_3d0 = DAT_03193200;
    local_3e8 = node.inst;
    local_3e0 = (Value *)makeSigning(node,JS_UNSIGNED);
    op_17.str._M_str = (char *)local_3e0;
    op_17.str._M_len = local_3d0;
    this_local = (ExpressionProcessor *)
                 cashew::ValueBuilder::makeBinary((ValueBuilder *)local_3c0,local_3d8,op_17,in_R8);
    break;
  case GtSInt32:
    local_3f8 = RVar3.inst;
    local_3f0 = (Value *)makeSigning(RVar3,JS_SIGNED);
    local_408.inst = cashew::GT.inst;
    local_400 = DAT_03193210;
    local_418 = node.inst;
    local_410 = (Value *)makeSigning(node,JS_SIGNED);
    op_18.str._M_str = (char *)local_410;
    op_18.str._M_len = local_400;
    this_local = (ExpressionProcessor *)
                 cashew::ValueBuilder::makeBinary((ValueBuilder *)local_3f0,local_408,op_18,in_R8);
    break;
  case GtUInt32:
    local_428 = RVar3.inst;
    local_420 = (Value *)makeSigning(RVar3,JS_UNSIGNED);
    local_438.inst = cashew::GT.inst;
    local_430 = DAT_03193210;
    local_448 = node.inst;
    local_440 = (Value *)makeSigning(node,JS_UNSIGNED);
    op_19.str._M_str = (char *)local_440;
    op_19.str._M_len = local_430;
    this_local = (ExpressionProcessor *)
                 cashew::ValueBuilder::makeBinary((ValueBuilder *)local_420,local_438,op_19,in_R8);
    break;
  case GeSInt32:
    local_458 = RVar3.inst;
    local_450 = (Value *)makeSigning(RVar3,JS_SIGNED);
    local_468.inst = cashew::GE.inst;
    local_460 = DAT_031931f0;
    local_478 = node.inst;
    local_470 = (Value *)makeSigning(node,JS_SIGNED);
    op_20.str._M_str = (char *)local_470;
    op_20.str._M_len = local_460;
    this_local = (ExpressionProcessor *)
                 cashew::ValueBuilder::makeBinary((ValueBuilder *)local_450,local_468,op_20,in_R8);
    break;
  case GeUInt32:
    local_488 = RVar3.inst;
    local_480 = (Value *)makeSigning(RVar3,JS_UNSIGNED);
    local_498.inst = cashew::GE.inst;
    local_490 = DAT_031931f0;
    local_4a8 = node.inst;
    local_4a0 = (Value *)makeSigning(node,JS_UNSIGNED);
    op_21.str._M_str = (char *)local_4a0;
    op_21.str._M_len = local_490;
    this_local = (ExpressionProcessor *)
                 cashew::ValueBuilder::makeBinary((ValueBuilder *)local_480,local_498,op_21,in_R8);
    break;
  default:
    handle_unreachable("unhandled i32 binary operator",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                       ,0x77e);
  case EqFloat32:
  case EqFloat64:
    local_4c0 = cashew::EQ.inst;
    local_4b8 = DAT_03193220;
    op_22.str._M_str = (char *)node.inst;
    op_22.str._M_len = DAT_03193220;
    local_4c8 = node.inst;
    local_4b0 = RVar3.inst;
    this_local = (ExpressionProcessor *)
                 cashew::ValueBuilder::makeBinary((ValueBuilder *)RVar3.inst,cashew::EQ,op_22,in_R8)
    ;
    break;
  case NeFloat32:
  case NeFloat64:
    local_4e0 = cashew::NE.inst;
    local_4d8 = DAT_03193230;
    op_23.str._M_str = (char *)node.inst;
    op_23.str._M_len = DAT_03193230;
    local_4e8 = node.inst;
    local_4d0 = RVar3.inst;
    this_local = (ExpressionProcessor *)
                 cashew::ValueBuilder::makeBinary((ValueBuilder *)RVar3.inst,cashew::NE,op_23,in_R8)
    ;
    break;
  case LtFloat32:
  case LtFloat64:
    local_560 = cashew::LT.inst;
    local_558 = DAT_031931e0;
    op_27.str._M_str = (char *)node.inst;
    op_27.str._M_len = DAT_031931e0;
    local_568 = node.inst;
    local_550 = RVar3.inst;
    this_local = (ExpressionProcessor *)
                 cashew::ValueBuilder::makeBinary((ValueBuilder *)RVar3.inst,cashew::LT,op_27,in_R8)
    ;
    break;
  case LeFloat32:
  case LeFloat64:
    local_540 = cashew::LE.inst;
    local_538 = DAT_03193200;
    op_26.str._M_str = (char *)node.inst;
    op_26.str._M_len = DAT_03193200;
    local_548 = node.inst;
    local_530 = RVar3.inst;
    this_local = (ExpressionProcessor *)
                 cashew::ValueBuilder::makeBinary((ValueBuilder *)RVar3.inst,cashew::LE,op_26,in_R8)
    ;
    break;
  case GtFloat32:
  case GtFloat64:
    local_520 = cashew::GT.inst;
    local_518 = DAT_03193210;
    op_25.str._M_str = (char *)node.inst;
    op_25.str._M_len = DAT_03193210;
    local_528 = node.inst;
    local_510 = RVar3.inst;
    this_local = (ExpressionProcessor *)
                 cashew::ValueBuilder::makeBinary((ValueBuilder *)RVar3.inst,cashew::GT,op_25,in_R8)
    ;
    break;
  case GeFloat32:
  case GeFloat64:
    local_500 = cashew::GE.inst;
    local_4f8 = DAT_031931f0;
    op_24.str._M_str = (char *)node.inst;
    op_24.str._M_len = DAT_031931f0;
    local_508 = node.inst;
    local_4f0 = RVar3.inst;
    this_local = (ExpressionProcessor *)
                 cashew::ValueBuilder::makeBinary((ValueBuilder *)RVar3.inst,cashew::GE,op_24,in_R8)
    ;
  }
  return (Ref)(Value *)this_local;
}

Assistant:

Ref visitBinary(Binary* curr) {
      // normal binary
      Ref left = visit(curr->left, EXPRESSION_RESULT);
      Ref right = visit(curr->right, EXPRESSION_RESULT);
      Ref ret;
      switch (curr->type.getBasic()) {
        case Type::i32: {
          switch (curr->op) {
            case AddInt32:
              ret = ValueBuilder::makeBinary(left, PLUS, right);
              break;
            case SubInt32:
              ret = ValueBuilder::makeBinary(left, MINUS, right);
              break;
            case MulInt32: {
              if (curr->type == Type::i32) {
                // TODO: when one operand is a small int, emit a multiply
                return ValueBuilder::makeCall(MATH_IMUL, left, right);
              } else {
                return ValueBuilder::makeBinary(left, MUL, right);
              }
            }
            case DivSInt32:
              ret = ValueBuilder::makeBinary(makeSigning(left, JS_SIGNED),
                                             DIV,
                                             makeSigning(right, JS_SIGNED));
              break;
            case DivUInt32:
              ret = ValueBuilder::makeBinary(makeSigning(left, JS_UNSIGNED),
                                             DIV,
                                             makeSigning(right, JS_UNSIGNED));
              break;
            case RemSInt32:
              ret = ValueBuilder::makeBinary(makeSigning(left, JS_SIGNED),
                                             MOD,
                                             makeSigning(right, JS_SIGNED));
              break;
            case RemUInt32:
              ret = ValueBuilder::makeBinary(makeSigning(left, JS_UNSIGNED),
                                             MOD,
                                             makeSigning(right, JS_UNSIGNED));
              break;
            case AndInt32:
              ret = ValueBuilder::makeBinary(left, AND, right);
              break;
            case OrInt32:
              ret = ValueBuilder::makeBinary(left, OR, right);
              break;
            case XorInt32:
              ret = ValueBuilder::makeBinary(left, XOR, right);
              break;
            case ShlInt32:
              ret = ValueBuilder::makeBinary(left, LSHIFT, right);
              break;
            case ShrUInt32:
              ret = ValueBuilder::makeBinary(left, TRSHIFT, right);
              break;
            case ShrSInt32:
              ret = ValueBuilder::makeBinary(left, RSHIFT, right);
              break;
            case EqInt32: {
              return ValueBuilder::makeBinary(makeSigning(left, JS_SIGNED),
                                              EQ,
                                              makeSigning(right, JS_SIGNED));
            }
            case NeInt32: {
              return ValueBuilder::makeBinary(makeSigning(left, JS_SIGNED),
                                              NE,
                                              makeSigning(right, JS_SIGNED));
            }
            case LtSInt32:
              return ValueBuilder::makeBinary(makeSigning(left, JS_SIGNED),
                                              LT,
                                              makeSigning(right, JS_SIGNED));
            case LtUInt32:
              return ValueBuilder::makeBinary(makeSigning(left, JS_UNSIGNED),
                                              LT,
                                              makeSigning(right, JS_UNSIGNED));
            case LeSInt32:
              return ValueBuilder::makeBinary(makeSigning(left, JS_SIGNED),
                                              LE,
                                              makeSigning(right, JS_SIGNED));
            case LeUInt32:
              return ValueBuilder::makeBinary(makeSigning(left, JS_UNSIGNED),
                                              LE,
                                              makeSigning(right, JS_UNSIGNED));
            case GtSInt32:
              return ValueBuilder::makeBinary(makeSigning(left, JS_SIGNED),
                                              GT,
                                              makeSigning(right, JS_SIGNED));
            case GtUInt32:
              return ValueBuilder::makeBinary(makeSigning(left, JS_UNSIGNED),
                                              GT,
                                              makeSigning(right, JS_UNSIGNED));
            case GeSInt32:
              return ValueBuilder::makeBinary(makeSigning(left, JS_SIGNED),
                                              GE,
                                              makeSigning(right, JS_SIGNED));
            case GeUInt32:
              return ValueBuilder::makeBinary(makeSigning(left, JS_UNSIGNED),
                                              GE,
                                              makeSigning(right, JS_UNSIGNED));
            case EqFloat32:
            case EqFloat64:
              return ValueBuilder::makeBinary(left, EQ, right);
            case NeFloat32:
            case NeFloat64:
              return ValueBuilder::makeBinary(left, NE, right);
            case GeFloat32:
            case GeFloat64:
              return ValueBuilder::makeBinary(left, GE, right);
            case GtFloat32:
            case GtFloat64:
              return ValueBuilder::makeBinary(left, GT, right);
            case LeFloat32:
            case LeFloat64:
              return ValueBuilder::makeBinary(left, LE, right);
            case LtFloat32:
            case LtFloat64:
              return ValueBuilder::makeBinary(left, LT, right);
            case RotLInt32:
            case RotRInt32:
              WASM_UNREACHABLE("should be removed already");
            default:
              WASM_UNREACHABLE("unhandled i32 binary operator");
          }
          break;
        }
        case Type::f32:
        case Type::f64:
          switch (curr->op) {
            case AddFloat32:
            case AddFloat64:
              ret = ValueBuilder::makeBinary(left, PLUS, right);
              break;
            case SubFloat32:
            case SubFloat64:
              ret = ValueBuilder::makeBinary(left, MINUS, right);
              break;
            case MulFloat32:
            case MulFloat64:
              ret = ValueBuilder::makeBinary(left, MUL, right);
              break;
            case DivFloat32:
            case DivFloat64:
              ret = ValueBuilder::makeBinary(left, DIV, right);
              break;
            case MinFloat32:
            case MinFloat64:
              ret = ValueBuilder::makeCall(MATH_MIN, left, right);
              break;
            case MaxFloat32:
            case MaxFloat64:
              ret = ValueBuilder::makeCall(MATH_MAX, left, right);
              break;
            case CopySignFloat32:
            case CopySignFloat64:
            default:
              Fatal() << "Unhandled binary float operator: ";
          }
          if (curr->type == Type::f32) {
            return makeJsCoercion(ret, JS_FLOAT);
          }
          return ret;
        default:
          Fatal() << "Unhandled type in binary: " << *curr;
      }
      return makeJsCoercion(ret, wasmToJsType(curr->type));
    }